

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

bool __thiscall libcellml::Generator::GeneratorImpl::modifiedProfile(GeneratorImpl *this)

{
  Profile PVar1;
  int iVar2;
  GeneratorProfilePtr *in_RDX;
  string profileContents;
  string local_58;
  string local_38;
  
  generatorProfileAsString_abi_cxx11_(&local_38,(libcellml *)&this->mProfile,in_RDX);
  PVar1 = GeneratorProfile::profile
                    ((this->mProfile).
                     super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (PVar1 == C) {
    sha1(&local_58,&local_38);
  }
  else {
    sha1(&local_58,&local_38);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return iVar2 != 0;
}

Assistant:

bool Generator::GeneratorImpl::modifiedProfile() const
{
    std::string profileContents = generatorProfileAsString(mProfile);

    return (mProfile->profile() == GeneratorProfile::Profile::C) ?
               sha1(profileContents) != C_GENERATOR_PROFILE_SHA1 :
               sha1(profileContents) != PYTHON_GENERATOR_PROFILE_SHA1;
}